

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuWorker.cpp
# Opt level: O1

void __thiscall xmrig::CpuWorker<2UL>::CpuWorker(CpuWorker<2UL> *this,size_t id,CpuLaunchData *data)

{
  AlgoVariant AVar1;
  VirtualMemory *this_00;
  
  Worker::Worker(&this->super_Worker,id,data->affinity,data->priority);
  (this->super_Worker).super_IWorker._vptr_IWorker = (_func_int **)&PTR__CpuWorker_001afe48;
  (this->m_assembly).m_id = (data->assembly).m_id;
  this->m_hwAES = data->hwAES;
  AVar1 = CpuLaunchData::av(data);
  this->m_av = AVar1;
  this->m_miner = data->miner;
  this->m_hash[0x30] = '\0';
  this->m_hash[0x31] = '\0';
  this->m_hash[0x32] = '\0';
  this->m_hash[0x33] = '\0';
  this->m_hash[0x34] = '\0';
  this->m_hash[0x35] = '\0';
  this->m_hash[0x36] = '\0';
  this->m_hash[0x37] = '\0';
  this->m_hash[0x38] = '\0';
  this->m_hash[0x39] = '\0';
  this->m_hash[0x3a] = '\0';
  this->m_hash[0x3b] = '\0';
  this->m_hash[0x3c] = '\0';
  this->m_hash[0x3d] = '\0';
  this->m_hash[0x3e] = '\0';
  this->m_hash[0x3f] = '\0';
  this->m_hash[0x20] = '\0';
  this->m_hash[0x21] = '\0';
  this->m_hash[0x22] = '\0';
  this->m_hash[0x23] = '\0';
  this->m_hash[0x24] = '\0';
  this->m_hash[0x25] = '\0';
  this->m_hash[0x26] = '\0';
  this->m_hash[0x27] = '\0';
  this->m_hash[0x28] = '\0';
  this->m_hash[0x29] = '\0';
  this->m_hash[0x2a] = '\0';
  this->m_hash[0x2b] = '\0';
  this->m_hash[0x2c] = '\0';
  this->m_hash[0x2d] = '\0';
  this->m_hash[0x2e] = '\0';
  this->m_hash[0x2f] = '\0';
  this->m_hash[0x10] = '\0';
  this->m_hash[0x11] = '\0';
  this->m_hash[0x12] = '\0';
  this->m_hash[0x13] = '\0';
  this->m_hash[0x14] = '\0';
  this->m_hash[0x15] = '\0';
  this->m_hash[0x16] = '\0';
  this->m_hash[0x17] = '\0';
  this->m_hash[0x18] = '\0';
  this->m_hash[0x19] = '\0';
  this->m_hash[0x1a] = '\0';
  this->m_hash[0x1b] = '\0';
  this->m_hash[0x1c] = '\0';
  this->m_hash[0x1d] = '\0';
  this->m_hash[0x1e] = '\0';
  this->m_hash[0x1f] = '\0';
  this->m_hash[0] = '\0';
  this->m_hash[1] = '\0';
  this->m_hash[2] = '\0';
  this->m_hash[3] = '\0';
  this->m_hash[4] = '\0';
  this->m_hash[5] = '\0';
  this->m_hash[6] = '\0';
  this->m_hash[7] = '\0';
  this->m_hash[8] = '\0';
  this->m_hash[9] = '\0';
  this->m_hash[10] = '\0';
  this->m_hash[0xb] = '\0';
  this->m_hash[0xc] = '\0';
  this->m_hash[0xd] = '\0';
  this->m_hash[0xe] = '\0';
  this->m_hash[0xf] = '\0';
  this->m_ctx[0] = (cryptonight_ctx *)0x0;
  this->m_ctx[1] = (cryptonight_ctx *)0x0;
  this->m_memory = (VirtualMemory *)0x0;
  memset(&this->m_job,0,0x200);
  (this->m_job).m_jobs[0].m_seed.m_data = (char *)0x0;
  (this->m_job).m_jobs[0].m_seed.m_size = 0;
  (this->m_job).m_jobs[0].m_size = 0;
  (this->m_job).m_jobs[0].m_clientId.m_data = (char *)0x0;
  (this->m_job).m_jobs[0].m_clientId.m_size = 0;
  (this->m_job).m_jobs[0].m_extraNonce.m_data = (char *)0x0;
  (this->m_job).m_jobs[0].m_extraNonce.m_size = 0;
  (this->m_job).m_jobs[0].m_id.m_data = (char *)0x0;
  (this->m_job).m_jobs[0].m_id.m_size = 0;
  (this->m_job).m_jobs[0].m_poolWallet.m_data = (char *)0x0;
  *(undefined8 *)((long)&(this->m_job).m_jobs[0].m_poolWallet.m_data + 4) = 0;
  *(undefined8 *)((long)&(this->m_job).m_jobs[0].m_poolWallet.m_size + 4) = 0;
  memset(&(this->m_job).m_jobs[0].m_diff,0,0x99);
  memset(&(this->m_job).m_jobs[1].m_diff,0,0x99);
  (this->m_job).m_jobs[0].m_extraIters = 0;
  (this->m_job).m_jobs[1].m_seed.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_seed.m_size = 0;
  (this->m_job).m_jobs[1].m_size = 0;
  (this->m_job).m_jobs[1].m_clientId.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_clientId.m_size = 0;
  (this->m_job).m_jobs[1].m_extraNonce.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_extraNonce.m_size = 0;
  (this->m_job).m_jobs[1].m_id.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_id.m_size = 0;
  (this->m_job).m_jobs[1].m_poolWallet.m_data = (char *)0x0;
  (this->m_job).m_jobs[1].m_poolWallet.m_size = 0;
  (this->m_job).m_jobs[1].m_backend = 0;
  (this->m_job).m_jobs[1].m_extraIters = 0;
  (this->m_job).m_rounds[0] = 0;
  (this->m_job).m_rounds[1] = 0;
  *(undefined8 *)((long)(this->m_job).m_rounds + 1) = 0;
  *(undefined8 *)((long)&(this->m_job).m_sequence + 1) = 0;
  this_00 = (VirtualMemory *)operator_new(0x20);
  VirtualMemory::VirtualMemory
            (this_00,0x200000,data->hugePages,true,(this->super_Worker).m_node,0x40);
  this->m_memory = this_00;
  return;
}

Assistant:

xmrig::CpuWorker<N>::CpuWorker(size_t id, const CpuLaunchData &data) :
    Worker(id, data.affinity, data.priority),
    m_assembly(data.assembly),
    m_hwAES(data.hwAES),
    m_av(data.av()),
    m_miner(data.miner),
    m_ctx()
{
    m_memory = new VirtualMemory(CnAlgo::CN_MEMORY * N, data.hugePages, true, m_node);
}